

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::ListFileScope::ListFileScope(ListFileScope *this,cmMakefile *mf,string *filenametoread)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmStateSnapshot local_38;
  
  this->Makefile = mf;
  this->ReportError = true;
  cmListFileBacktrace::Push((cmListFileBacktrace *)&local_38,(string *)&mf->Backtrace);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &this->Makefile->Backtrace,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&local_38
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.Position);
  cmState::CreateInlineListFileSnapshot
            (&local_38,this->Makefile->GlobalGenerator->CMakeInstance->State,
             &this->Makefile->StateSnapshot,filenametoread);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = local_38.Position.Position;
  (pcVar1->StateSnapshot).State = local_38.State;
  (pcVar1->StateSnapshot).Position.Tree = local_38.Position.Tree;
  bVar2 = cmStateSnapshot::IsValid(&this->Makefile->StateSnapshot);
  if (bVar2) {
    PushFunctionBlockerBarrier(this->Makefile);
    return;
  }
  __assert_fail("this->Makefile->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmMakefile.cxx"
                ,0x25a,"cmMakefile::ListFileScope::ListFileScope(cmMakefile *, const std::string &)"
               );
}

Assistant:

ListFileScope(cmMakefile* mf, std::string const& filenametoread)
    : Makefile(mf)
    , ReportError(true)
  {
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(filenametoread);

    this->Makefile->StateSnapshot =
      this->Makefile->GetState()->CreateInlineListFileSnapshot(
        this->Makefile->StateSnapshot, filenametoread);
    assert(this->Makefile->StateSnapshot.IsValid());

    this->Makefile->PushFunctionBlockerBarrier();
  }